

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrASL0x06(CPU *this)

{
  uint16_t addr;
  Memory *this_00;
  byte value;
  byte bVar1;
  byte bVar2;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this_00 = this->m;
  bVar2 = Memory::Read8(this_00,(ushort)bVar1);
  value = bVar2 * '\x02';
  this->field_0x2e = bVar2 & 0x80 | value >> 7 | (value == 0) << 6 | this->field_0x2e & 0x3e;
  Memory::Write8(this_00,(ushort)bVar1,value);
  return 5;
}

Assistant:

int CPU::instrASL0x06() {
	uint16_t address = zeropage_addr_j();
	m->Write8(address, ASL(m->Read8(address)));
	return 5;
}